

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_euler(REF_DBL *state,REF_DBL *direction,REF_DBL *flux)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL gamma;
  REF_DBL speed;
  REF_DBL e;
  REF_DBL p;
  REF_DBL w;
  REF_DBL v;
  REF_DBL u;
  REF_DBL rho;
  REF_DBL *flux_local;
  REF_DBL *direction_local;
  REF_DBL *state_local;
  
  dVar1 = *state;
  dVar2 = state[1];
  dVar3 = state[2];
  dVar4 = state[3];
  dVar5 = state[4];
  dVar6 = dVar4 * direction[2] + dVar2 * *direction + dVar3 * direction[1];
  *flux = dVar1 * dVar6;
  flux[1] = dVar1 * dVar6 * dVar2 + dVar5 * *direction;
  flux[2] = dVar1 * dVar6 * dVar3 + dVar5 * direction[1];
  flux[3] = dVar1 * dVar6 * dVar4 + dVar5 * direction[2];
  flux[4] = dVar6 * (dVar1 * 0.5 * (dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3) +
                     dVar5 / 0.3999999999999999 + dVar5);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_euler(REF_DBL *state, REF_DBL *direction,
                                  REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, e, speed;
  REF_DBL gamma = 1.4;

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];

  e = p / (gamma - 1.0) + 0.5 * rho * (u * u + v * v + w * w);

  speed = u * direction[0] + v * direction[1] + w * direction[2];

  flux[0] = rho * speed;
  flux[1] = rho * speed * u + p * direction[0];
  flux[2] = rho * speed * v + p * direction[1];
  flux[3] = rho * speed * w + p * direction[2];
  flux[4] = speed * (e + p);

  return REF_SUCCESS;
}